

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int *piVar1;
  int iVar2;
  undefined1 local_e0 [8];
  stbi__context s;
  
  s.io.skip = (_func_void_void_ptr_int *)clbk->eof;
  piVar1 = &s.read_from_callbacks;
  s.img_n = *(int *)&clbk->read;
  s.img_out_n = *(int *)((long)&clbk->read + 4);
  s.io.read._0_4_ = *(undefined4 *)&clbk->skip;
  s.io.read._4_4_ = *(undefined4 *)((long)&clbk->skip + 4);
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)user;
  s.img_buffer_end = (stbi_uc *)piVar1;
  iVar2 = (*clbk->read)(user,(char *)piVar1,0x80);
  if (iVar2 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar2 + (long)piVar1);
  }
  s.buffer_start._120_8_ = piVar1;
  iVar2 = stbi__hdr_test((stbi__context *)local_e0);
  return iVar2;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   return 0;
   #endif
}